

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

Argument * __thiscall
argparse::ArgumentParser::add_argument<char_const*>(ArgumentParser *this,char *f_args)

{
  pointer pAVar1;
  reference pAVar2;
  __off64_t *in_R8;
  size_t in_R9;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *this_00;
  _List_const_iterator<argparse::Argument> local_48;
  _List_node_base *local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  const_iterator local_28;
  _List_iterator<argparse::Argument> local_20;
  iterator argument;
  char *f_args_local;
  ArgumentParser *this_local;
  
  argument._M_node = (_List_node_base *)f_args;
  local_28 = std::cend<std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>>
                       (&this->m_optional_arguments);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,(char *)argument._M_node);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>::
       emplace<std::__cxx11::string&,std::array<std::basic_string_view<char,std::char_traits<char>>,1ul>>
                 ((list<argparse::Argument,std::allocator<argparse::Argument>> *)
                  &this->m_optional_arguments,local_28,&this->m_prefix_chars,
                  (array<std::basic_string_view<char,_std::char_traits<char>_>,_1UL> *)&local_38);
  pAVar1 = std::_List_iterator<argparse::Argument>::operator->(&local_20);
  if (((byte)pAVar1->field_0x140 >> 1 & 1) == 0) {
    this_00 = &this->m_positional_arguments;
    local_40 = (_List_node_base *)
               std::cend<std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>>
                         (&this->m_positional_arguments);
    std::_List_const_iterator<argparse::Argument>::_List_const_iterator(&local_48,&local_20);
    std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::splice
              (this_00,(int)local_40,(__off64_t *)&this->m_optional_arguments,(int)local_48._M_node,
               in_R8,in_R9,(uint)this_00);
  }
  index_argument(this,(argument_it)local_20._M_node);
  pAVar2 = std::_List_iterator<argparse::Argument>::operator*(&local_20);
  return pAVar2;
}

Assistant:

Argument &add_argument(Targs... f_args) {
    using array_of_sv = std::array<std::string_view, sizeof...(Targs)>;
    auto argument =
        m_optional_arguments.emplace(std::cend(m_optional_arguments),
                                     m_prefix_chars, array_of_sv{f_args...});

    if (!argument->m_is_optional) {
      m_positional_arguments.splice(std::cend(m_positional_arguments),
                                    m_optional_arguments, argument);
    }

    index_argument(argument);
    return *argument;
  }